

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O1

ChNodeMeshless * __thiscall
chrono::fea::ChNodeMeshless::operator=(ChNodeMeshless *this,ChNodeMeshless *other)

{
  double dVar1;
  ChCollisionModel *pCVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  if (other != this) {
    ChNodeXYZ::operator=(&this->super_ChNodeXYZ,&other->super_ChNodeXYZ);
    (*this->collision_model->_vptr_ChCollisionModel[3])();
    pCVar2 = this->collision_model;
    local_38 = (other->container->matsurface).
               super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_30 = (other->container->matsurface).
               super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_30->_M_use_count = local_30->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_30->_M_use_count = local_30->_M_use_count + 1;
      }
    }
    local_28 = 0;
    uStack_20 = 0;
    local_18 = 0;
    (*pCVar2->_vptr_ChCollisionModel[0x13])(other->coll_rad,pCVar2,&local_38);
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
    (*this->collision_model->_vptr_ChCollisionModel[0x16])
              (this->collision_model,&(this->super_ChNodeXYZ).field_0x50);
    if (other != this) {
      (this->pos_ref).m_data[0] = (other->pos_ref).m_data[0];
      (this->pos_ref).m_data[1] = (other->pos_ref).m_data[1];
      (this->pos_ref).m_data[2] = (other->pos_ref).m_data[2];
      (this->UserForce).m_data[0] = (other->UserForce).m_data[0];
      (this->UserForce).m_data[1] = (other->UserForce).m_data[1];
      (this->UserForce).m_data[2] = (other->UserForce).m_data[2];
    }
    dVar1 = other->h_rad;
    this->h_rad = dVar1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar1 * 0.5 - this->coll_rad;
    auVar3 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar3);
    collision::ChCollisionModelBullet::SetSphereRadius
              ((ChCollisionModelBullet *)this->collision_model,this->coll_rad,auVar3._0_8_);
    dVar1 = other->coll_rad;
    this->coll_rad = dVar1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = this->h_rad * 0.5 - dVar1;
    auVar3 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar4);
    collision::ChCollisionModelBullet::SetSphereRadius
              ((ChCollisionModelBullet *)this->collision_model,dVar1,auVar3._0_8_);
    (**(code **)((long)(other->super_ChNodeXYZ).super_ChLoadableUVW + 0x90))(other);
    (**(code **)((long)(this->super_ChNodeXYZ).super_ChLoadableUVW + 0x98))(this);
    this->volume = other->volume;
    this->density = other->density;
    this->hardening = other->hardening;
    dVar1 = (other->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    (this->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         (other->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    (this->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = dVar1;
    dVar1 = (other->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    (this->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
         (other->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    (this->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = dVar1;
    dVar1 = (other->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    (this->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
         (other->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    (this->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = dVar1;
    dVar1 = (other->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    (this->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         (other->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    (this->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = dVar1;
    dVar1 = (other->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    (this->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
         (other->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    (this->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = dVar1;
    dVar1 = (other->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    (this->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
         (other->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    (this->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = dVar1;
    dVar1 = (other->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    (this->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         (other->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    (this->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = dVar1;
    dVar1 = (other->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    (this->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
         (other->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    (this->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = dVar1;
    dVar1 = (other->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    (this->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
         (other->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    (this->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = dVar1;
    dVar1 = (other->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    (this->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         (other->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    (this->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = dVar1;
    dVar1 = (other->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    (this->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
         (other->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    (this->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = dVar1;
    dVar1 = (other->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    (this->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
         (other->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    (this->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = dVar1;
    this->container = other->container;
    ChVariablesNode::operator=(&this->variables,&other->variables);
  }
  return this;
}

Assistant:

ChNodeMeshless& ChNodeMeshless::operator=(const ChNodeMeshless& other) {
    if (&other == this)
        return *this;

    ChNodeXYZ::operator=(other);

    collision_model->ClearModel();
    collision_model->AddPoint(other.container->GetMaterialSurface(), other.coll_rad);

    collision_model->SetContactable(this);

    pos_ref = other.pos_ref;
    UserForce = other.UserForce;
    SetKernelRadius(other.h_rad);
    SetCollisionRadius(other.coll_rad);
    SetMass(other.GetMass());
    volume = other.volume;
    density = other.density;
    hardening = other.hardening;

    t_strain = other.t_strain;
    p_strain = other.p_strain;
    e_strain = other.e_strain;
    e_stress = other.e_stress;

    container = other.container;

    variables = other.variables;

    return *this;
}